

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cow_guarded.hpp
# Opt level: O3

handle * __thiscall
gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::lock
          (handle *__return_storage_ptr__,cow_guarded<int,_std::timed_mutex> *this)

{
  atomic<int> *paVar1;
  __int_type _Var2;
  mutex_type *pmVar3;
  bool bVar4;
  uint uVar5;
  int *piVar6;
  unique_lock<std::timed_mutex> guard;
  unique_lock<std::timed_mutex> local_50;
  unique_lock<std::timed_mutex> local_40;
  cow_guarded<int,_std::timed_mutex> *local_30;
  undefined1 local_28;
  
  local_50._M_device = &this->m_writeMutex;
  local_50._M_owns = false;
  std::unique_lock<std::timed_mutex>::lock(&local_50);
  local_50._M_owns = true;
  uVar5 = (byte)~(this->m_data).m_countingLeft._M_base._M_i & 1;
  LOCK();
  paVar1 = &(this->m_data).m_leftReadCount + uVar5;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  _Var2 = (this->m_data).m_readingLeft._M_base._M_i;
  piVar6 = (int *)operator_new(4);
  bVar4 = local_50._M_owns;
  pmVar3 = local_50._M_device;
  *piVar6 = **(int **)((long)&(this->m_data).m_left.
                              super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                      (ulong)(((byte)~_Var2 & 1) << 4));
  LOCK();
  paVar1 = &(this->m_data).m_leftReadCount + uVar5;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + -1;
  UNLOCK();
  local_50._M_device = (mutex_type *)0x0;
  local_50._M_owns = false;
  local_28 = 0;
  *(mutex_type **)
   &(__return_storage_ptr__->
    super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>)._M_t.
    super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>._M_t.
    super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
    super__Tuple_impl<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
    super__Head_base<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter,_false> =
       pmVar3;
  *(bool *)((long)&(__return_storage_ptr__->
                   super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                   )._M_t.
                   super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                   .
                   super__Tuple_impl<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                   .
                   super__Head_base<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter,_false>
           + 8) = bVar4;
  local_40._M_device = (mutex_type *)0x0;
  local_40._M_owns = false;
  *(bool *)((long)&(__return_storage_ptr__->
                   super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                   )._M_t.
                   super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                   .
                   super__Tuple_impl<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
                   .
                   super__Head_base<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter,_false>
           + 0x18) = false;
  *(cow_guarded<int,_std::timed_mutex> **)
   ((long)&(__return_storage_ptr__->
           super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>).
           _M_t.
           super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
           ._M_t.
           super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>
           .super__Tuple_impl<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
           super__Head_base<1UL,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter,_false>
   + 0x10) = this;
  (__return_storage_ptr__->
  super_unique_ptr<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>)._M_t.
  super___uniq_ptr_impl<int,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>._M_t.
  super__Tuple_impl<0UL,_int_*,_gmlc::libguarded::cow_guarded<int,_std::timed_mutex>::deleter>.
  super__Head_base<0UL,_int_*,_false>._M_head_impl = piVar6;
  local_30 = this;
  std::unique_lock<std::timed_mutex>::~unique_lock(&local_40);
  std::unique_lock<std::timed_mutex>::~unique_lock(&local_50);
  return __return_storage_ptr__;
}

Assistant:

auto cow_guarded<T, M>::lock() -> handle
{
    std::unique_lock<M> guard(m_writeMutex);

    auto data(m_data.lock_shared());
    std::unique_ptr<T> val(new T(**data));
    data.reset();

    return handle(val.release(), deleter(std::move(guard), *this));
}